

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall
haVoc::Movehistory::update
          (Movehistory *this,position *p,Move *m,Move *previous,int16 *depth,Score *eval,
          vector<Move,_std::allocator<Move>_> *quiets,Move *killers)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  Score SVar4;
  Color CVar5;
  pointer pMVar6;
  U8 UVar7;
  pointer pMVar8;
  byte bVar9;
  int iVar10;
  byte bVar11;
  
  SVar4 = *eval;
  if (m->type == '\n') {
    iVar10 = (int)*depth * (int)*depth;
    CVar5 = (p->ifo).stm;
    bVar11 = m->f;
    bVar2 = m->t;
    piVar1 = (this->history)._M_elems[CVar5]._M_elems[bVar11]._M_elems + bVar2;
    *piVar1 = *piVar1 + iVar10;
    bVar9 = previous->f;
    bVar3 = previous->t;
    (&(this->counters)._M_elems[0]._M_elems[bVar3].f)[(uint)bVar9 * 0xc0] = bVar11;
    (&(this->counters)._M_elems[0]._M_elems[bVar3].t)[(uint)bVar9 * 0xc0] = bVar2;
    (&(this->counters)._M_elems[0]._M_elems[bVar3].type)[(uint)bVar9 * 0xc0] = '\n';
    if (((SVar4 < mate_max_ply) &&
        (((bVar11 != killers[2].f || (bVar2 != killers[2].t)) || (m->type != killers[2].type)))) &&
       (((bVar11 != killers[3].f || (bVar2 != killers[3].t)) || (m->type != killers[3].type)))) {
      bVar9 = killers->t;
      if ((killers->t != bVar2 || bVar11 != killers->f) || (bVar9 = bVar2, m->type != killers->type)
         ) {
        killers[1].f = killers->f;
        killers[1].t = bVar9;
        killers[1].type = killers->type;
        bVar11 = m->f;
        killers->f = bVar11;
        killers->t = m->t;
        killers->type = m->type;
      }
    }
    pMVar6 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pMVar8 = (quiets->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                  super__Vector_impl_data._M_start; pMVar8 != pMVar6; pMVar8 = pMVar8 + 1) {
      if (bVar11 != pMVar8->f) {
        piVar1 = (this->history)._M_elems[CVar5]._M_elems[pMVar8->f]._M_elems + pMVar8->t;
        *piVar1 = *piVar1 - iVar10;
      }
    }
  }
  if (((~mated_max_ply < SVar4) &&
      (((UVar7 = m->f, UVar7 != killers->f || (m->t != killers->t)) || (m->type != killers->type))))
     && (((UVar7 != killers[1].f || (m->t != killers[1].t)) || (m->type != killers[1].type)))) {
    if (UVar7 == killers[2].f) {
      UVar7 = killers[2].t;
      if ((m->t == killers[2].t) && (UVar7 = m->t, m->type == killers[2].type)) {
        return;
      }
    }
    else {
      UVar7 = killers[2].t;
    }
    killers[3].f = killers[2].f;
    killers[3].t = UVar7;
    killers[3].type = killers[2].type;
    killers[2].f = m->f;
    killers[2].t = m->t;
    killers[2].type = m->type;
  }
  return;
}

Assistant:

void Movehistory::update(const position& p,
		const Move& m,
		const Move& previous,
		const int16& depth,
		const Score& eval,
		const std::vector<Move>& quiets,
		Move* killers) {

		const Color c = p.to_move();
		int score = pow(depth, 2);
		if (m.type == Movetype::quiet) {
			history[c][m.f][m.t] += score;
			counters[previous.f][previous.t] = m;
			if (eval < Score::mate_max_ply &&
				m != killers[2] &&
				m != killers[3] &&
				m != killers[0]) {
				killers[1] = killers[0];
				killers[0] = m;
			}
			for (auto& q : quiets) {
				if (m.f == q.f) continue;
				history[c][q.f][q.t] -= score;
			}
		}

		// mate killers
		if (eval >= Score::mate_max_ply &&
			m != killers[0] &&
			m != killers[1] &&
			m != killers[2]) {
			killers[3] = killers[2];
			killers[2] = m;
		}
	}